

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

int ixxx::posix::setsockopt(int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  int iVar1;
  setsockopt_error *this;
  int *piVar2;
  
  iVar1 = ::setsockopt(__fd,__level,__optname,__optval,__optlen);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (setsockopt_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  setsockopt_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&setsockopt_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

int setsockopt(int sockfd, int level, int optname, const void *optval, socklen_t optlen)
    {
#if defined(__MINGW32__) || defined(__MINGW64__)
      int r = ::setsockopt(sockfd, level, optname,
              static_cast<const char*>(optval), optlen);
#else
      int r = ::setsockopt(sockfd, level, optname, optval, optlen);
#endif
      if (r == -1)
        throw setsockopt_error(errno);
      return r;
    }